

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix33<double> * __thiscall
Imath_2_5::Matrix33<double>::operator*(Matrix33<double> *this,Matrix33<double> *v)

{
  long in_RDX;
  long in_RSI;
  Matrix33<double> *in_RDI;
  int k;
  int j;
  int i;
  Matrix33<double> *tmp;
  int local_24;
  int local_20;
  int local_1c;
  
  Matrix33(in_RDI,0.0);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
        in_RDI->x[local_1c][local_20] =
             *(double *)(in_RSI + (long)local_1c * 0x18 + (long)local_24 * 8) *
             *(double *)(in_RDX + (long)local_24 * 0x18 + (long)local_20 * 8) +
             in_RDI->x[local_1c][local_20];
      }
    }
  }
  return in_RDI;
}

Assistant:

Matrix33<T>
Matrix33<T>::operator * (const Matrix33<T> &v) const
{
    Matrix33 tmp (T (0));

    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            for (int k = 0; k < 3; k++)
                tmp.x[i][j] += x[i][k] * v.x[k][j];

    return tmp;
}